

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::BreakpointEvent>::construct
          (BasicTypeInfo<dap::BreakpointEvent> *this,void *ptr)

{
  memset(ptr,0,0x210);
  BreakpointEvent::BreakpointEvent((BreakpointEvent *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }